

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

bool __thiscall
helics::LogManager::sendToLogger
          (LogManager *this,int logLevel,string_view header,string_view message,bool fromRemote)

{
  int iVar1;
  pointer ppVar2;
  logger *plVar3;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  uint logLevel_00;
  level_enum lVar7;
  size_t size;
  byte *__src;
  pointer ppVar8;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  ActionMessage remMess;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  char *local_110;
  size_t local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  _Any_data *local_f0;
  ActionMessage local_e8;
  
  __src = (byte *)message._M_str;
  size = message._M_len;
  local_110 = header._M_str;
  local_108 = header._M_len;
  logLevel_00 = logLevel - 99999;
  if (logLevel < 0x1863c) {
    logLevel_00 = logLevel;
  }
  bVar6 = 0x1863b < logLevel || fromRemote;
  bVar5 = true;
  if ((bVar6) || ((int)logLevel_00 <= (this->maxLogLevel).super___atomic_base<int>._M_i)) {
    local_120._M_len = size;
    local_120._M_str = (char *)__src;
    local_100._M_len = local_108;
    local_100._M_str = local_110;
    LogBuffer::push(&this->mLogBuffer,logLevel_00,(string_view)header,(string_view)message);
    if (!fromRemote) {
      ppVar8 = (this->remoteTargets).
               super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->remoteTargets).
               super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar2) {
        local_f0 = (_Any_data *)&this->mTransmit;
        do {
          if (((((int)logLevel_00 <= ppVar8->second) &&
               (iVar1 = (ppVar8->first).gid, iVar1 != -2010000000)) && (iVar1 != -1700000000)) &&
             ((this->mTransmit).super__Function_base._M_manager != (_Manager_type)0x0)) {
            ActionMessage::ActionMessage(&local_e8,cmd_remote_log);
            local_e8.dest_id.gid = (ppVar8->first).gid;
            str._M_str = local_110;
            str._M_len = local_108;
            ActionMessage::setString(&local_e8,0,str);
            sVar4 = size;
            if ((__src != local_e8.payload.heap) &&
               (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
              local_e8.payload.bufferSize = size;
              memcpy(local_e8.payload.heap,__src,size);
              sVar4 = local_e8.payload.bufferSize;
            }
            local_e8.payload.bufferSize = sVar4;
            if ((this->mTransmit).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->mTransmit)._M_invoker)(local_f0,&local_e8);
            ActionMessage::~ActionMessage(&local_e8);
          }
          ppVar8 = ppVar8 + 1;
        } while (ppVar8 != ppVar2);
      }
    }
    if ((this->loggerFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
      if (((this->initialized)._M_base._M_i & 1U) != 0) {
        if (!(bool)(~bVar6 & this->consoleLogLevel < (int)logLevel_00)) {
          plVar3 = (this->consoleLogger).
                   super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (logLevel_00 == 0xfffffff6) {
            local_e8.messageAction = cmd_ignore;
            local_e8.messageID = 0;
            local_e8.source_id.gid = 0;
            local_e8.source_handle.hid = 0;
            local_e8.dest_id.gid = 0;
            local_e8.dest_handle.hid = 0;
            loc.funcname = (char *)0x0;
            loc.filename = (char *)0x0;
            loc.line = 0;
            loc._12_4_ = 0;
            fmt.size_ = 2;
            fmt.data_ = "{}";
            spdlog::logger::log_<std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,loc,trace,fmt,&local_120);
          }
          else {
            lVar7 = trace;
            if ((((int)logLevel_00 < 0x18) && (lVar7 = debug, (int)logLevel_00 < 0xf)) &&
               (lVar7 = info, (int)logLevel_00 < 6)) {
              lVar7 = warn;
              if (((int)logLevel_00 < 3) && (lVar7 = info, logLevel_00 != 2)) {
                lVar7 = ~logLevel_00 >> 0x1f ^ critical;
              }
            }
            local_e8.messageAction = cmd_ignore;
            local_e8.messageID = 0;
            local_e8.source_id.gid = 0;
            local_e8.source_handle.hid = 0;
            local_e8.dest_id.gid = 0;
            local_e8.dest_handle.hid = 0;
            loc_00.funcname = (char *)0x0;
            loc_00.filename = (char *)0x0;
            loc_00.line = 0;
            loc_00._12_4_ = 0;
            fmt_00.size_ = 6;
            fmt_00.data_ = "{}::{}";
            spdlog::logger::
            log_<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,loc_00,lVar7,fmt_00,&local_100,&local_120);
          }
          if (((this->forceLoggingFlush)._M_base._M_i & 1U) != 0) {
            spdlog::logger::flush
                      ((this->consoleLogger).
                       super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        plVar3 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((plVar3 != (logger *)0x0) && (!(bool)(~bVar6 & this->fileLogLevel < (int)logLevel_00)))
        {
          if (logLevel_00 == 0xfffffff6) {
            local_e8.messageAction = cmd_ignore;
            local_e8.messageID = 0;
            local_e8.source_id.gid = 0;
            local_e8.source_handle.hid = 0;
            local_e8.dest_id.gid = 0;
            local_e8.dest_handle.hid = 0;
            loc_01.funcname = (char *)0x0;
            loc_01.filename = (char *)0x0;
            loc_01.line = 0;
            loc_01._12_4_ = 0;
            fmt_01.size_ = 2;
            fmt_01.data_ = "{}";
            spdlog::logger::log_<std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,loc_01,trace,fmt_01,&local_120);
          }
          else {
            lVar7 = trace;
            if ((((int)logLevel_00 < 0x18) && (lVar7 = debug, (int)logLevel_00 < 0xf)) &&
               (lVar7 = info, (int)logLevel_00 < 6)) {
              lVar7 = warn;
              if (((int)logLevel_00 < 3) && (lVar7 = info, logLevel_00 != 2)) {
                lVar7 = ~logLevel_00 >> 0x1f ^ critical;
              }
            }
            local_e8.messageAction = cmd_ignore;
            local_e8.messageID = 0;
            local_e8.source_id.gid = 0;
            local_e8.source_handle.hid = 0;
            local_e8.dest_id.gid = 0;
            local_e8.dest_handle.hid = 0;
            loc_02.funcname = (char *)0x0;
            loc_02.filename = (char *)0x0;
            loc_02.line = 0;
            loc_02._12_4_ = 0;
            fmt_02.size_ = 6;
            fmt_02.data_ = "{}::{}";
            spdlog::logger::
            log_<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,loc_02,lVar7,fmt_02,&local_100,&local_120);
          }
          if (((this->forceLoggingFlush)._M_base._M_i & 1U) != 0) {
            spdlog::logger::flush
                      ((this->fileLogger).
                       super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        return true;
      }
    }
    else if (bVar6 || ((int)logLevel_00 <= this->fileLogLevel ||
                      (int)logLevel_00 <= this->consoleLogLevel)) {
      __args_1._M_str = local_110;
      __args_1._M_len = local_108;
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&this->loggerFunction,logLevel_00,__args_1,
                   (basic_string_view<char,_std::char_traits<char>_>)message);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool LogManager::sendToLogger(int logLevel,
                              std::string_view header,
                              std::string_view message,
                              bool fromRemote) const
{
    bool alwaysLog{fromRemote};
    if (logLevel > LogLevels::FED - 100) {
        logLevel -= static_cast<int>(LogLevels::FED);
        alwaysLog = true;
    }

    if (logLevel > maxLogLevel && !alwaysLog) {
        // check the logging level
        return true;
    }

    mLogBuffer.push(logLevel, header, message);
    if (!fromRemote) {
        for (const auto& rl : remoteTargets) {
            if (rl.second >= logLevel && rl.first.isValid()) {
                if (mTransmit) {
                    ActionMessage remMess(CMD_REMOTE_LOG);
                    remMess.dest_id = rl.first;
                    remMess.setString(0, header);
                    remMess.payload = message;
                    mTransmit(std::move(remMess));
                }
            }
        }
    }

    if (loggerFunction) {
        if (consoleLogLevel >= logLevel || fileLogLevel >= logLevel || alwaysLog) {
            loggerFunction(logLevel, header, message);
        }
    } else if (initialized.load()) {
        if (consoleLogLevel >= logLevel || alwaysLog) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                consoleLogger->log(spdlog::level::trace, "{}", message);
            } else {
                consoleLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                consoleLogger->flush();
            }
        }
        if (fileLogger && (fileLogLevel >= logLevel || alwaysLog)) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                fileLogger->log(spdlog::level::trace, "{}", message);
            } else {
                fileLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                fileLogger->flush();
            }
        }
        return true;
    }
    return false;
}